

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Slice.h
# Opt level: O1

string_view __thiscall
arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
stringView(SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *this)

{
  byte bVar1;
  byte *pbVar2;
  ulong uVar3;
  Exception *this_00;
  long lVar4;
  string_view sVar5;
  
  pbVar2 = *(byte **)this;
  bVar1 = *pbVar2;
  if ((byte)(bVar1 - 0x40) < 0x7f) {
    uVar3 = (ulong)(bVar1 - 0x40);
    lVar4 = 1;
  }
  else {
    if (bVar1 != 0xbf) {
      this_00 = (Exception *)__cxa_allocate_exception(0x18);
      Exception::Exception(this_00,InvalidValueType,"Expecting type String");
      __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
    }
    uVar3 = *(ulong *)(pbVar2 + 1);
    lVar4 = 9;
  }
  sVar5._M_str = pbVar2 + lVar4;
  sVar5._M_len = uVar3;
  return sVar5;
}

Assistant:

uint8_t const* getDataPtr() const noexcept { return _start; }